

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O2

void Bdc_SpfdDecomposeTest3(void)

{
  word *pwVar1;
  word *pwVar2;
  Vec_Wrd_t *p;
  word wVar3;
  Vec_Wrd_t *p_00;
  abctime aVar4;
  long lVar5;
  abctime aVar6;
  long lVar7;
  abctime time;
  abctime time_00;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  
  Aig_ManRandom64(1);
  iVar8 = 0x4000000;
  p = Vec_WrdAlloc(0x4000000);
  while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
    wVar3 = Aig_ManRandom64(0);
    Vec_WrdPush(p,wVar3);
  }
  iVar8 = 8;
  p_00 = Vec_WrdAlloc(8);
  while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
    wVar3 = Aig_ManRandom64(0);
    Vec_WrdPush(p_00,wVar3);
  }
  aVar4 = Abc_Clock();
  pwVar1 = p->pArray;
  pwVar2 = p_00->pArray;
  uVar9 = 0;
  for (lVar5 = 0; lVar5 != 0x4000000; lVar5 = lVar5 + 1) {
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      uVar9 = (ulong)((int)uVar9 + (uint)((pwVar2[lVar7] & ~pwVar1[lVar5]) == 0));
    }
  }
  printf("Total = %8d.  ",uVar9);
  aVar6 = Abc_Clock();
  Abc_PrintTime(0x7bf12c,(char *)(aVar6 - aVar4),time);
  aVar4 = Abc_Clock();
  uVar9 = 0;
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    for (lVar7 = 0; lVar7 != 0x4000000; lVar7 = lVar7 + 1) {
      uVar9 = (ulong)((int)uVar9 + (uint)((~pwVar1[lVar7] & pwVar2[lVar5]) == 0));
    }
  }
  printf("Total = %8d.  ",uVar9);
  aVar6 = Abc_Clock();
  Abc_PrintTime(0x7bf12c,(char *)(aVar6 - aVar4),time_00);
  return;
}

Assistant:

void Bdc_SpfdDecomposeTest3()
{
    int nSizeM = (1 << 26);
    int nSizeK = (1 << 3);
    Vec_Wrd_t * v1M;
    Vec_Wrd_t * v1K;
    int i, k, Counter;
    abctime clk;
//    int EntryM, EntryK;
    Aig_ManRandom64( 1 );

    v1M = Vec_WrdAlloc( nSizeM );
    for ( i = 0; i < nSizeM; i++ )
        Vec_WrdPush( v1M, Aig_ManRandom64(0) );

    v1K = Vec_WrdAlloc( nSizeK );
    for ( i = 0; i < nSizeK; i++ )
        Vec_WrdPush( v1K, Aig_ManRandom64(0) );

    clk = Abc_Clock();
    Counter = 0;
    for ( i = 0; i < nSizeM; i++ )
    for ( k = 0; k < nSizeK; k++ )
        Counter += ((v1M->pArray[i] & v1K->pArray[k]) == v1K->pArray[k]);
//    Vec_WrdForEachEntry( v1M, EntryM, i )
//    Vec_WrdForEachEntry( v1K, EntryK, k )
//        Counter += ((EntryM & EntryK) == EntryK);

    printf( "Total = %8d.  ", Counter );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    Counter = 0;
    for ( k = 0; k < nSizeK; k++ )
    for ( i = 0; i < nSizeM; i++ )
        Counter += ((v1M->pArray[i] & v1K->pArray[k]) == v1K->pArray[k]);
    printf( "Total = %8d.  ", Counter );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

}